

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath * __thiscall
testing::internal::FilePath::RemoveDirectoryName(FilePath *__return_storage_ptr__,FilePath *this)

{
  char *pcVar1;
  allocator local_31;
  string local_30;
  
  pcVar1 = FindLastPathSeparator(this);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  else {
    std::__cxx11::string::string((string *)&local_30,pcVar1 + 1,&local_31);
    FilePath(__return_storage_ptr__,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveDirectoryName() const {
  const char* const last_sep = FindLastPathSeparator();
  return last_sep ? FilePath(last_sep + 1) : *this;
}